

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

void __thiscall Samba::writeByte(Samba *this,uint32_t addr,uint8_t value)

{
  int iVar1;
  pointer pSVar2;
  SambaError *this_00;
  char local_23 [8];
  uint8_t cmd [14];
  uint8_t value_local;
  uint32_t addr_local;
  Samba *this_local;
  
  cmd[6] = value;
  cmd._7_4_ = addr;
  unique0x10000148 = this;
  if ((this->_debug & 1U) != 0) {
    printf("%s(addr=%#x,value=%#x)\n","writeByte",(ulong)addr,(ulong)value);
  }
  snprintf(local_23,0xe,"O%08X,%02X#",(ulong)(uint)cmd._7_4_,(ulong)cmd[6]);
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  iVar1 = (*pSVar2->_vptr_SerialPort[6])(pSVar2,local_23,0xd);
  if (iVar1 != 0xd) {
    this_00 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(this_00);
    __cxa_throw(this_00,&SambaError::typeinfo,SambaError::~SambaError);
  }
  if ((this->_isUsb & 1U) != 0) {
    pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    (*pSVar2->_vptr_SerialPort[10])();
  }
  return;
}

Assistant:

void
Samba::writeByte(uint32_t addr, uint8_t value)
{
    uint8_t cmd[14];

    if (_debug)
        printf("%s(addr=%#x,value=%#x)\n", __FUNCTION__, addr, value);

    snprintf((char*) cmd, sizeof(cmd), "O%08X,%02X#", addr, value);
    if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) -  1)
        throw SambaError();

    // The SAM firmware has a bug that if the command and binary data
    // are received in the same USB data packet, then the firmware
    // gets confused.  Even though the writes are separated in the code,
    // USB drivers often do write combining which can put them together
    // in the same USB data packet.  To avoid this, we call the serial
    // port object's flush method before writing the data.
    if (_isUsb)
        _port->flush();
}